

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

char * __thiscall CDefineTable::Get(CDefineTable *this,char *name)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  uint local_34;
  CDefineTableEntry *local_28;
  CDefineTableEntry *p;
  char *name_local;
  CDefineTable *this_local;
  
  this->DefArrayList = (CStringsList *)0x0;
  if ((name == (char *)0x0) || (*name == '\0')) {
    return (char *)0x0;
  }
  if (name[1] == '_') {
    iVar2 = strcmp(name,"__COUNTER__");
    if (iVar2 == 0) {
      snprintf(defineGet__Counter__Buffer,0x1e,"%d",(ulong)(uint)PredefinedCounter);
      this_local = (CDefineTable *)defineGet__Counter__Buffer;
      PredefinedCounter = PredefinedCounter + 1;
      return (char *)this_local;
    }
    iVar2 = strcmp(name,"__LINE__");
    if (iVar2 == 0) {
      bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
      if (bVar1) {
        local_34 = 0;
      }
      else {
        pvVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
        local_34 = pvVar3->line;
      }
      snprintf(defineGet__Line__Buffer,0x1e,"%d",(ulong)local_34);
      this_local = (CDefineTable *)defineGet__Line__Buffer;
      return (char *)this_local;
    }
  }
  local_28 = this->defs[(int)((int)*name & 0x7f)];
  while( true ) {
    bVar1 = false;
    if (local_28 != (CDefineTableEntry *)0x0) {
      iVar2 = strcmp(name,local_28->name);
      bVar1 = iVar2 != 0;
    }
    if (!bVar1) break;
    local_28 = local_28->next;
  }
  if (local_28 == (CDefineTableEntry *)0x0) {
    this_local = (CDefineTable *)0x0;
  }
  else {
    this->DefArrayList = local_28->nss;
    this_local = (CDefineTable *)local_28->value;
  }
  return (char *)this_local;
}

Assistant:

const char* CDefineTable::Get(const char* name) {
	DefArrayList = nullptr;
	if (nullptr == name || 0 == name[0]) return nullptr;
	// the __COUNTER__ and __LINE__ have fully dynamic custom implementation here
	if ('_' == name[1]) {
		if (!strcmp(name, "__COUNTER__")) {
			SPRINTF1(defineGet__Counter__Buffer, 30, "%d", PredefinedCounter);
			++PredefinedCounter;
			return defineGet__Counter__Buffer;
		}
		if (!strcmp(name, "__LINE__")) {
			SPRINTF1(defineGet__Line__Buffer, 30, "%d", sourcePosStack.empty() ? 0 : sourcePosStack.back().line);
			return defineGet__Line__Buffer;
		}
	}
	CDefineTableEntry* p = defs[(*name)&127];
	while (p && strcmp(name, p->name)) p = p->next;
	if (nullptr == p) return nullptr;
	DefArrayList = p->nss;
	return p->value;
}